

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O1

void __thiscall
PS2KeyboardAnalyzerResults::GetCommandName
          (PS2KeyboardAnalyzerResults *this,char *returnstr,U64 code,double DeviceType)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  if ((DeviceType != 0.0) || (NAN(DeviceType))) {
    switch(code) {
    case 0xe6:
      uVar3._0_1_ = 'S';
      uVar3._1_1_ = 'E';
      uVar3._2_1_ = 'T';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'S';
      uVar5._1_1_ = 'C';
      uVar5._2_1_ = 'A';
      uVar5._3_1_ = 'L';
      uVar7._0_1_ = 'I';
      uVar7._1_1_ = 'N';
      uVar7._2_1_ = 'G';
      uVar7._3_1_ = ' ';
      uVar9._0_1_ = '1';
      uVar9._1_1_ = ':';
      uVar9._2_1_ = '1';
      uVar9._3_1_ = '\0';
      break;
    case 0xe7:
      builtin_strncpy(returnstr,"SET SCALING TO 2:1",0x13);
      return;
    case 0xe8:
      builtin_strncpy(returnstr + 7,"OLUTION",8);
      uVar1 = 0x4f53455220544553;
      goto LAB_001071bd;
    case 0xe9:
      builtin_strncpy(returnstr + 7,"REQUEST",8);
      uVar1 = 0x5220535554415453;
      goto LAB_001071bd;
    case 0xea:
      uVar3._0_1_ = 'S';
      uVar3._1_1_ = 'E';
      uVar3._2_1_ = 'T';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'S';
      uVar5._1_1_ = 'T';
      uVar5._2_1_ = 'R';
      uVar5._3_1_ = 'E';
      uVar7._0_1_ = 'A';
      uVar7._1_1_ = 'M';
      uVar7._2_1_ = ' ';
      uVar7._3_1_ = 'M';
      uVar9._0_1_ = 'O';
      uVar9._1_1_ = 'D';
      uVar9._2_1_ = 'E';
      uVar9._3_1_ = '\0';
      break;
    case 0xeb:
      builtin_strncpy(returnstr,"READ DATA",10);
      return;
    case 0xec:
      uVar3._0_1_ = 'R';
      uVar3._1_1_ = 'E';
      uVar3._2_1_ = 'S';
      uVar3._3_1_ = 'E';
      uVar5._0_1_ = 'T';
      uVar5._1_1_ = ' ';
      uVar5._2_1_ = 'W';
      uVar5._3_1_ = 'R';
      uVar7._0_1_ = 'A';
      uVar7._1_1_ = 'P';
      uVar7._2_1_ = ' ';
      uVar7._3_1_ = 'M';
      uVar9._0_1_ = 'O';
      uVar9._1_1_ = 'D';
      uVar9._2_1_ = 'E';
      uVar9._3_1_ = '\0';
      break;
    default:
      goto switchD_00106eeb_caseD_ef;
    case 0xee:
      builtin_strncpy(returnstr + 6,"AP MODE",8);
      uVar1 = 0x5041525720544553;
      goto LAB_001071bd;
    case 0xf0:
      uVar3._0_1_ = 'S';
      uVar3._1_1_ = 'E';
      uVar3._2_1_ = 'T';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'R';
      uVar5._1_1_ = 'E';
      uVar5._2_1_ = 'M';
      uVar5._3_1_ = 'O';
      uVar7._0_1_ = 'T';
      uVar7._1_1_ = 'E';
      uVar7._2_1_ = ' ';
      uVar7._3_1_ = 'M';
      uVar9._0_1_ = 'O';
      uVar9._1_1_ = 'D';
      uVar9._2_1_ = 'E';
      uVar9._3_1_ = '\0';
      break;
    case 0xf2:
      builtin_strncpy(returnstr + 6,"VICE ID",8);
      uVar1 = 0x4956454420544547;
      goto LAB_001071bd;
    case 0xf3:
      uVar3._0_1_ = 'S';
      uVar3._1_1_ = 'E';
      uVar3._2_1_ = 'T';
      uVar3._3_1_ = ' ';
      uVar5._0_1_ = 'S';
      uVar5._1_1_ = 'A';
      uVar5._2_1_ = 'M';
      uVar5._3_1_ = 'P';
      uVar7._0_1_ = 'L';
      uVar7._1_1_ = 'E';
      uVar7._2_1_ = ' ';
      uVar7._3_1_ = 'R';
      uVar9._0_1_ = 'A';
      uVar9._1_1_ = 'T';
      uVar9._2_1_ = 'E';
      uVar9._3_1_ = '\0';
      break;
    case 0xf4:
      builtin_strncpy(returnstr,"ENABLE DATA REPORTING",0x16);
      return;
    case 0xf5:
      builtin_strncpy(returnstr,"DISABLE DATA REPORTING",0x17);
      return;
    case 0xf6:
      goto switchD_00106eeb_caseD_f6;
    case 0xfe:
      builtin_strncpy(returnstr,"RESEND",7);
      return;
    case 0xff:
      builtin_strncpy(returnstr,"RESET MOUSE",0xc);
      return;
    }
    goto LAB_001071a1;
  }
  switch(code) {
  case 0xed:
    builtin_strncpy(returnstr,"SET LEDs",9);
    return;
  case 0xee:
    builtin_strncpy(returnstr,"SEND ECHO",10);
    return;
  default:
switchD_00106eeb_caseD_ef:
    builtin_strncpy(returnstr,"DATA FRAME",0xb);
    return;
  case 0xf0:
    builtin_strncpy(returnstr + 5,"CANCODE",8);
    uVar1 = 0x4e41435320544553;
    goto LAB_001071bd;
  case 0xf2:
    builtin_strncpy(returnstr + 7,"VICE ID",8);
    uVar1 = 0x5645442044414552;
    goto LAB_001071bd;
  case 0xf3:
    builtin_strncpy(returnstr,"SET REPEAT",0xb);
    return;
  case 0xf4:
    uVar3._0_1_ = 'K';
    uVar3._1_1_ = 'E';
    uVar3._2_1_ = 'Y';
    uVar3._3_1_ = 'B';
    uVar5._0_1_ = 'O';
    uVar5._1_1_ = 'A';
    uVar5._2_1_ = 'R';
    uVar5._3_1_ = 'D';
    uVar7._0_1_ = ' ';
    uVar7._1_1_ = 'E';
    uVar7._2_1_ = 'N';
    uVar7._3_1_ = 'A';
    uVar9._0_1_ = 'B';
    uVar9._1_1_ = 'L';
    uVar9._2_1_ = 'E';
    uVar9._3_1_ = '\0';
    break;
  case 0xf5:
    uVar2._0_1_ = 'K';
    uVar2._1_1_ = 'E';
    uVar2._2_1_ = 'Y';
    uVar2._3_1_ = 'B';
    uVar4._0_1_ = 'O';
    uVar4._1_1_ = 'A';
    uVar4._2_1_ = 'R';
    uVar4._3_1_ = 'D';
    uVar6._0_1_ = ' ';
    uVar6._1_1_ = 'D';
    uVar6._2_1_ = 'I';
    uVar6._3_1_ = 'S';
    uVar8._0_1_ = 'A';
    uVar8._1_1_ = 'B';
    uVar8._2_1_ = 'L';
    uVar8._3_1_ = 'E';
    goto LAB_0010705d;
  case 0xf6:
switchD_00106eeb_caseD_f6:
    builtin_strncpy(returnstr + 5,"EFAULTS",8);
    uVar1 = 0x4146454420544553;
    goto LAB_001071bd;
  case 0xf7:
    builtin_strncpy(returnstr + 10,"YS REPEAT CODES",0x10);
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = 'E';
    uVar3._2_1_ = 'T';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'A';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = ' ';
    uVar7._0_1_ = 'K';
    uVar7._1_1_ = 'E';
    uVar7._2_1_ = 'Y';
    uVar7._3_1_ = 'S';
    uVar9._0_1_ = ' ';
    uVar9._1_1_ = 'R';
    uVar9._2_1_ = 'E';
    uVar9._3_1_ = 'P';
    break;
  case 0xf8:
    builtin_strncpy(returnstr + 0xf,"KE, BREAK CODES",0x10);
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = 'E';
    uVar3._2_1_ = 'T';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'A';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = ' ';
    uVar7._0_1_ = 'K';
    uVar7._1_1_ = 'E';
    uVar7._2_1_ = 'Y';
    uVar7._3_1_ = 'S';
    uVar9._0_1_ = ' ';
    uVar9._1_1_ = 'M';
    uVar9._2_1_ = 'A';
    uVar9._3_1_ = 'K';
    break;
  case 0xf9:
    builtin_strncpy(returnstr + 0xd,"MAKE CODES ONLY",0x10);
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = 'E';
    uVar3._2_1_ = 'T';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'A';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = ' ';
    uVar7._0_1_ = 'K';
    uVar7._1_1_ = 'E';
    uVar7._2_1_ = 'Y';
    uVar7._3_1_ = 'S';
    uVar9._0_1_ = ' ';
    uVar9._1_1_ = 'M';
    uVar9._2_1_ = 'A';
    uVar9._3_1_ = 'K';
    break;
  case 0xfa:
    builtin_strncpy(returnstr,"SET ALL KEYS MAKE, BREAK, REPEAT CODES",0x27);
    return;
  case 0xfb:
    builtin_strncpy(returnstr,"SET KEY REPEAT CODES",0x15);
    return;
  case 0xfc:
    builtin_strncpy(returnstr + 10,"KE, BREAK CODES",0x10);
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = 'E';
    uVar3._2_1_ = 'T';
    uVar3._3_1_ = ' ';
    uVar5._0_1_ = 'K';
    uVar5._1_1_ = 'E';
    uVar5._2_1_ = 'Y';
    uVar5._3_1_ = ' ';
    uVar7._0_1_ = 'M';
    uVar7._1_1_ = 'A';
    uVar7._2_1_ = 'K';
    uVar7._3_1_ = 'E';
    uVar9._0_1_ = ',';
    uVar9._1_1_ = ' ';
    uVar9._2_1_ = 'B';
    uVar9._3_1_ = 'R';
    break;
  case 0xfd:
    builtin_strncpy(returnstr,"SET KEY MAKE CODES ONLY",0x18);
    return;
  case 0xfe:
    uVar2._0_1_ = 'R';
    uVar2._1_1_ = 'E';
    uVar2._2_1_ = 'S';
    uVar2._3_1_ = 'E';
    uVar4._0_1_ = 'N';
    uVar4._1_1_ = 'D';
    uVar4._2_1_ = ' ';
    uVar4._3_1_ = 'L';
    uVar6._0_1_ = 'A';
    uVar6._1_1_ = 'S';
    uVar6._2_1_ = 'T';
    uVar6._3_1_ = ' ';
    uVar8._0_1_ = 'D';
    uVar8._1_1_ = 'A';
    uVar8._2_1_ = 'T';
    uVar8._3_1_ = 'A';
LAB_0010705d:
    *(undefined4 *)returnstr = uVar2;
    *(undefined4 *)(returnstr + 4) = uVar4;
    *(undefined4 *)(returnstr + 8) = uVar6;
    *(undefined4 *)(returnstr + 0xc) = uVar8;
    returnstr[0x10] = '\0';
    return;
  case 0xff:
    builtin_strncpy(returnstr + 7,"EYBOARD",8);
    uVar1 = 0x454b205445534552;
LAB_001071bd:
    *(undefined8 *)returnstr = uVar1;
    return;
  }
LAB_001071a1:
  *(undefined4 *)returnstr = uVar3;
  *(undefined4 *)(returnstr + 4) = uVar5;
  *(undefined4 *)(returnstr + 8) = uVar7;
  *(undefined4 *)(returnstr + 0xc) = uVar9;
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GetCommandName( char returnstr[], U64 code, double DeviceType )
{
    if( DeviceType == 0 )
    {
        switch( code )
        {
        case CMD_WRITE_LEDS:
            sprintf( returnstr, "SET LEDs" );
            break;
        case CMD_ECHO:
            sprintf( returnstr, "SEND ECHO" );
            break;
        case CMD_SET_SCANCODE_SET:
            sprintf( returnstr, "SET SCANCODE" );
            break;
        case CMD_READ_ID:
            sprintf( returnstr, "READ DEVICE ID" );
            break;
        case CMD_SET_REPEAT:
            sprintf( returnstr, "SET REPEAT" );
            break;
        case CMD_KEYBOARD_ENABLE:
            sprintf( returnstr, "KEYBOARD ENABLE" );
            break;
        case CMD_KEYBOARD_DISABLE:
            sprintf( returnstr, "KEYBOARD DISABLE" );
            break;
        case CMD_SET_DEFAULTS:
            sprintf( returnstr, "SET DEFAULTS" );
            break;
        case CMD_SET_ALL_KEYS_REPEAT:
            sprintf( returnstr, "SET ALL KEYS REPEAT CODES" );
            break;
        case CMD_SET_ALL_KEYS_MAKEBREAK_CODES:
            sprintf( returnstr, "SET ALL KEYS MAKE, BREAK CODES" );
            break;
        case CMD_SET_ALL_KEYS_MAKE_CODES:
            sprintf( returnstr, "SET ALL KEYS MAKE CODES ONLY" );
            break;
        case CMD_SET_ALL_REPEAT_AND_MAKEBREAK_CODES:
            sprintf( returnstr, "SET ALL KEYS MAKE, BREAK, REPEAT CODES" );
            break;
        case CMD_SET_SINGLE_REPEAT:
            sprintf( returnstr, "SET KEY REPEAT CODES" );
            break;
        case CMD_SET_SINGLE_MAKEBREAK_CODES:
            sprintf( returnstr, "SET KEY MAKE, BREAK CODES" );
            break;
        case CMD_SET_SINGLE_MAKE_CODES:
            sprintf( returnstr, "SET KEY MAKE CODES ONLY" );
            break;
        case CMD_RESEND:
            sprintf( returnstr, "RESEND LAST DATA" );
            break;
        case CMD_KEYBOARD_RESET:
            sprintf( returnstr, "RESET KEYBOARD" );
            break;
        default:
            sprintf( returnstr, "DATA FRAME" );
        }
    }
    else
    {
        switch( code )
        {
        case MOUSE_CMD_SET_SCALING2to1:
            sprintf( returnstr, "SET SCALING TO 2:1" );
            break;
        case MOUSE_CMD_SET_SCALING1to1:
            sprintf( returnstr, "SET SCALING 1:1" );
            break;
        case MOUSE_CMD_SET_RESOLUTION:
            sprintf( returnstr, "SET RESOLUTION" );
            break;
        case MOUSE_CMD_STATUS_REQUEST:
            sprintf( returnstr, "STATUS REQUEST" );
            break;
        case MOUSE_CMD_SET_STREAM_MODE:
            sprintf( returnstr, "SET STREAM MODE" );
            break;
        case MOUSE_CMD_READ_DATA:
            sprintf( returnstr, "READ DATA" );
            break;
        case MOUSE_CMD_RESET_WRAP_MODE:
            sprintf( returnstr, "RESET WRAP MODE" );
            break;
        case MOUSE_CMD_SET_WRAP_MODE:
            sprintf( returnstr, "SET WRAP MODE" );
            break;
        case MOUSE_CMD_SET_REMOTE_MODE:
            sprintf( returnstr, "SET REMOTE MODE" );
            break;
        case MOUSE_CMD_GET_DEVICE_ID:
            sprintf( returnstr, "GET DEVICE ID" );
            break;
        case MOUSE_CMD_SET_SAMPLE_RATE:
            sprintf( returnstr, "SET SAMPLE RATE" );
            break;
        case MOUSE_CMD_ENABLE_DATA_REPORTING:
            sprintf( returnstr, "ENABLE DATA REPORTING" );
            break;
        case MOUSE_CMD_DISABLE_DATA_REPORTING:
            sprintf( returnstr, "DISABLE DATA REPORTING" );
            break;
        case MOUSE_CMD_SET_DEFAULTS:
            sprintf( returnstr, "SET DEFAULTS" );
            break;
        case MOUSE_CMD_RESEND:
            sprintf( returnstr, "RESEND" );
            break;
        case MOUSE_CMD_RESET:
            sprintf( returnstr, "RESET MOUSE" );
            break;
        default:
            sprintf( returnstr, "DATA FRAME" );
        }
    }
}